

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3 * rbuOpenDbhandle(sqlite3rbu *p,char *zName,int bUseVfs)

{
  sqlite3 *db;
  int iVar1;
  char *pcVar2;
  sqlite3 *local_18;
  
  local_18 = (sqlite3 *)0x0;
  if (p->rc == 0) {
    if (bUseVfs == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = p->zVfsName;
    }
    iVar1 = openDatabase(zName,&local_18,0x46,pcVar2);
    db = local_18;
    p->rc = iVar1;
    if (iVar1 == 0) {
      return local_18;
    }
    pcVar2 = sqlite3_errmsg(local_18);
    pcVar2 = sqlite3_mprintf("%s",pcVar2);
    p->zErrmsg = pcVar2;
    sqlite3_close(db);
  }
  return (sqlite3 *)0x0;
}

Assistant:

static sqlite3 *rbuOpenDbhandle(
  sqlite3rbu *p, 
  const char *zName, 
  int bUseVfs
){
  sqlite3 *db = 0;
  if( p->rc==SQLITE_OK ){
    const int flags = SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|SQLITE_OPEN_URI;
    p->rc = sqlite3_open_v2(zName, &db, flags, bUseVfs ? p->zVfsName : 0);
    if( p->rc ){
      p->zErrmsg = sqlite3_mprintf("%s", sqlite3_errmsg(db));
      sqlite3_close(db);
      db = 0;
    }
  }
  return db;
}